

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode http_rw_hd(Curl_easy *data,char *hd,size_t hdlen,char *buf_remain,size_t blen,
                   size_t *pconsumed)

{
  ConnectBits *pCVar1;
  undefined1 *puVar2;
  int *piVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  curlntlm cVar7;
  curl_trc_feat *pcVar8;
  _Bool _Var9;
  CURLcode CVar10;
  CURLcode CVar11;
  int iVar12;
  statusline sVar13;
  uint uVar14;
  char *pcVar15;
  size_t hdlen_00;
  void *pvVar16;
  char *pcVar17;
  Curl_creader *pCVar18;
  uint uVar19;
  connectdata *pcVar20;
  dynbuf last_header;
  
  buf_remain[0] = '\0';
  buf_remain[1] = '\0';
  buf_remain[2] = '\0';
  buf_remain[3] = '\0';
  buf_remain[4] = '\0';
  buf_remain[5] = '\0';
  buf_remain[6] = '\0';
  buf_remain[7] = '\0';
  if ((*hd != '\r') && (*hd != '\n')) {
    iVar12 = (data->req).headerline;
    (data->req).headerline = iVar12 + 1;
    if (iVar12 == 0) {
      CVar10 = CURLE_UNSUPPORTED_PROTOCOL;
      (data->req).httpversion = 0;
      pcVar20 = data->conn;
      uVar14 = pcVar20->handler->protocol;
      pcVar15 = hd;
      if ((uVar14 & 3) == 0) {
        if ((uVar14 >> 0x12 & 1) == 0) goto LAB_00133e85;
        for (; (*pcVar15 == ' ' || (*pcVar15 == '\t')); pcVar15 = pcVar15 + 1) {
        }
        iVar12 = strncmp(pcVar15,"RTSP/",5);
        if (iVar12 != 0) goto LAB_00133e85;
        if (9 < (byte)(pcVar15[5] - 0x30U)) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (pcVar15[6] != '.') {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (9 < (byte)(pcVar15[7] - 0x30U)) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if ((pcVar15[8] != ' ') && (pcVar15[8] != '\t')) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (9 < (byte)(pcVar15[9] - 0x30U)) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (9 < (byte)(pcVar15[10] - 0x30U)) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (9 < (byte)(pcVar15[0xb] - 0x30U)) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        (data->req).httpcode =
             (uint)(byte)(pcVar15[0xb] - 0x30U) + (uint)(byte)(pcVar15[9] - 0x30U) * 100 +
             (uint)(byte)(pcVar15[10] * '\n' + 0x20);
        cVar5 = pcVar15[0xc];
        if (((cVar5 != '\t') && (cVar5 != ' ')) && (3 < (byte)(cVar5 - 10U))) {
          return CURLE_WEIRD_SERVER_REPLY;
        }
        (data->req).httpversion = 0xb;
      }
      else {
        for (; (*pcVar15 == ' ' || (*pcVar15 == '\t')); pcVar15 = pcVar15 + 1) {
        }
        iVar12 = strncmp(pcVar15,"HTTP/",5);
        if (iVar12 == 0) {
          bVar4 = pcVar15[5];
          if (1 < bVar4 - 0x32) {
            if (bVar4 != 0x31) {
              pcVar15 = "Unsupported HTTP version in response";
              goto LAB_00133b33;
            }
            if (((pcVar15[6] == '.') && ((pcVar15[7] & 0xfeU) == 0x30)) &&
               ((pcVar15[8] == ' ' || (pcVar15[8] == '\t')))) {
              (data->req).httpversion = (byte)pcVar15[7] - 0x26;
              if ((((byte)(pcVar15[9] - 0x30U) < 10) && ((byte)(pcVar15[10] - 0x30U) < 10)) &&
                 ((byte)(pcVar15[0xb] - 0x30U) < 10)) {
                (data->req).httpcode =
                     (uint)(byte)(pcVar15[0xb] - 0x30U) + (uint)(byte)(pcVar15[9] - 0x30U) * 100 +
                     (uint)(byte)(pcVar15[10] * '\n' + 0x20);
                cVar5 = pcVar15[0xc];
                if (((cVar5 == '\t') || (cVar5 == ' ')) || ((byte)(cVar5 - 10U) < 4))
                goto LAB_00133c97;
              }
            }
            pcVar15 = "Unsupported HTTP/1 subversion in response";
            goto LAB_00133b33;
          }
          if ((pcVar15[6] == ' ') || (pcVar15[6] == '\t')) {
            (data->req).httpversion = (uint)bVar4 * 10 + -0x1e0;
            if (((byte)(pcVar15[7] - 0x30U) < 10) &&
               (((byte)(pcVar15[8] - 0x30U) < 10 && ((byte)(pcVar15[9] - 0x30U) < 10)))) {
              (data->req).httpcode =
                   (uint)(byte)(pcVar15[9] - 0x30U) + (uint)(byte)(pcVar15[7] - 0x30U) * 100 +
                   (uint)(byte)(pcVar15[8] * '\n' + 0x20);
              cVar5 = pcVar15[10];
              if ((cVar5 == '\t') || ((cVar5 == ' ' || ((byte)(cVar5 - 10U) < 4))))
              goto LAB_00133c97;
            }
          }
        }
        sVar13 = checkhttpprefix(data,hd,hdlen);
        if (sVar13 != STATUS_DONE) {
LAB_00133e85:
          puVar2 = &(data->req).field_0xd9;
          *puVar2 = *puVar2 & 0xfe;
          return CURLE_WEIRD_SERVER_REPLY;
        }
        (data->req).httpversion = 10;
        (data->req).httpcode = 200;
        pcVar20 = data->conn;
      }
LAB_00133c97:
      CVar10 = Curl_http_statusline(data,pcVar20);
      if (CVar10 != CURLE_OK) {
        return CURLE_UNSUPPORTED_PROTOCOL;
      }
      iVar12 = 0xc;
    }
    else {
      iVar12 = 4;
    }
    CVar10 = CURLE_WEIRD_SERVER_REPLY;
    pvVar16 = memchr(hd,0,hdlen);
    if (pvVar16 == (void *)0x0) {
      iVar6 = (data->req).headerline;
      if ((iVar6 < 2) ||
         ((((*hd == ' ' || (*hd == '\t')) && (iVar6 != 2)) ||
          (pvVar16 = memchr(hd,0x3a,hdlen), pvVar16 != (void *)0x0)))) {
        CVar10 = Curl_http_header(data,hd,hdlen);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        Curl_debug(data,CURLINFO_HEADER_IN,hd,hdlen);
        iVar6 = iVar12 + 0x20;
        if (99 < (data->req).httpcode - 100U) {
          iVar6 = iVar12;
        }
        CVar10 = Curl_client_write(data,iVar6,hd,hdlen);
        if (CVar10 == CURLE_OK) {
          CVar10 = Curl_bump_headersize(data,hdlen,false);
          return CVar10;
        }
        return CVar10;
      }
      pcVar15 = "Header without colon";
    }
    else {
      pcVar15 = "Nul byte in header";
    }
LAB_00133b33:
    Curl_failf(data,pcVar15);
    return CVar10;
  }
  Curl_dyn_init(&last_header,hdlen + 1);
  CVar10 = Curl_dyn_addn(&last_header,hd,hdlen);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  Curl_dyn_reset(&(data->state).headerb);
  pcVar15 = Curl_dyn_ptr(&last_header);
  hdlen_00 = Curl_dyn_len(&last_header);
  pcVar20 = data->conn;
  if (((((data->req).upgr101 == UPGR101_RECEIVED) && (pcVar20->httpversion != '\x14')) &&
      (((data->set).field_0x8cd & 0x10) != 0)) &&
     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level)))) {
    Curl_infof(data,"Lying server, not serving HTTP/2");
  }
  uVar14 = (data->req).httpcode;
  if (pcVar15 != (char *)0x0 && (int)uVar14 < 200) {
    CVar10 = http_write_header(data,pcVar15,hdlen_00);
    if (CVar10 != CURLE_OK) goto LAB_00133aed;
    uVar14 = (data->req).httpcode;
    pcVar15 = (char *)0x0;
  }
  if ((int)uVar14 < 100) {
    Curl_failf(data,"Unsupported response code in HTTP response");
LAB_00133ad2:
    CVar10 = CURLE_UNSUPPORTED_PROTOCOL;
  }
  else {
    uVar19 = *(uint *)&(data->req).field_0xd9;
    if (uVar14 < 200) {
      *(uint *)&(data->req).field_0xd9 = uVar19 | 1;
      (data->req).headerline = 0;
      CVar10 = CURLE_OK;
      if ((char)uVar14 == 'e') {
        if (pcVar20->httpversion == '\v') {
          if ((data->req).upgr101 == UPGR101_H2) {
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                (0 < pcVar8->log_level)))) {
              Curl_infof(data,"Received 101, Switching to HTTP/2");
            }
            (data->req).upgr101 = UPGR101_RECEIVED;
            pCVar1 = &data->conn->bits;
            *pCVar1 = (ConnectBits)((ulong)*pCVar1 & 0xffffffffffdfffff);
            puVar2 = &(data->req).field_0xd9;
            *puVar2 = *puVar2 | 1;
            (data->req).headerline = 0;
            goto LAB_00133ad2;
          }
          *(uint *)&(data->req).field_0xd9 = uVar19 & 0xfffffffe;
        }
        else {
          Curl_failf(data,"unexpected 101 response code");
          CVar10 = CURLE_WEIRD_SERVER_REPLY;
        }
      }
      else if ((uVar14 & 0xff) == 100) {
        Curl_http_exp100_got100(data);
      }
    }
    else {
      *(uint *)&(data->req).field_0xd9 = uVar19 & 0xfffffffe;
      if ((data->req).upgr101 == UPGR101_H2) {
        pCVar1 = &data->conn->bits;
        *pCVar1 = (ConnectBits)((ulong)*pCVar1 & 0xffffffffffdfffff);
        Curl_multi_connchanged(data->multi);
      }
      if ((((data->req).size == -1) && (((data->req).field_0xda & 0x10) == 0)) &&
         ((((ulong)pcVar20->bits & 0x20) == 0 &&
          (((pcVar20->httpversion == '\v' && ((pcVar20->handler->protocol & 0x40000) == 0)) &&
           ((data->state).httpreq != '\x05')))))) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 || (0 < pcVar8->log_level))
           )) {
          Curl_infof(data,"no chunk, no close, no size. Assume close to signal end");
        }
        Curl_conncontrol(pcVar20,2);
      }
      uVar14 = (data->req).httpcode;
      uVar19 = uVar14;
      if (((ulong)pcVar20->bits & 0x20) != 0) {
        if (uVar14 == 0x197) {
          uVar19 = 0x197;
          cVar7 = pcVar20->proxy_ntlm_state;
        }
        else {
          if (uVar14 != 0x191) goto LAB_001340ea;
          uVar19 = 0x191;
          cVar7 = pcVar20->http_ntlm_state;
        }
        if (cVar7 == NTLMSTATE_TYPE2) {
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
              (0 < pcVar8->log_level)))) {
            Curl_infof(data,"Connection closure while negotiating auth (HTTP 1.0?)");
            uVar14 = (data->req).httpcode;
          }
          puVar2 = &(data->state).field_0x744;
          *puVar2 = *puVar2 | 0x20;
          uVar19 = uVar14;
        }
      }
LAB_001340ea:
      _Var9 = http_should_fail(data,uVar19);
      if (_Var9) {
        Curl_failf(data,"The requested URL returned error: %d",(ulong)uVar19);
        CVar10 = CURLE_HTTP_RETURNED_ERROR;
      }
      else {
        CVar10 = Curl_http_auth_act(data);
        if (CVar10 == CURLE_OK) {
          if (299 < (data->req).httpcode) {
            if ((((((data->req).field_0xdb & 4) == 0) && (((ulong)pcVar20->bits & 0x20) == 0)) &&
                (_Var9 = Curl_creader_will_rewind(data), !_Var9)) &&
               (((byte)((data->state).httpreq - 1) < 4 &&
                (_Var9 = Curl_req_done_sending(data), !_Var9)))) {
              if (((data->req).httpcode == 0x1a1) &&
                 (_Var9 = Curl_http_exp100_is_selected(data), _Var9)) {
                if ((((data->req).writebytecount == 0) &&
                    (pCVar18 = Curl_creader_get_by_type(data,&cr_exp100),
                    pCVar18 != (Curl_creader *)0x0)) && (*(int *)((long)pCVar18->ctx + 0x30) == 1))
                {
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar8->log_level)))) {
                    Curl_infof(data,"Got HTTP failure 417 while waiting for a 100");
                  }
                }
                else {
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar8->log_level)))) {
                    Curl_infof(data,"Got HTTP failure 417 while sending data");
                  }
                  Curl_conncontrol(pcVar20,2);
                  http_perhapsrewind(data,pcVar20);
                }
                puVar2 = &(data->state).field_0x744;
                *puVar2 = *puVar2 | 0x80;
                pcVar17 = (*Curl_cstrdup)((data->state).url);
                (data->req).newurl = pcVar17;
                Curl_req_abort_sending(data);
              }
              else {
                uVar14 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
                if ((uVar14 >> 0x14 & 1) == 0) {
                  if (((uVar14 >> 0x1c & 1) != 0) &&
                     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar8->log_level)))) {
                    Curl_infof(data,"HTTP error before end of send, stop sending");
                  }
                  Curl_conncontrol(pcVar20,2);
                  CVar10 = Curl_req_abort_sending(data);
                  if (CVar10 != CURLE_OK) goto LAB_00133ad5;
                }
                else {
                  if (((uVar14 >> 0x1c & 1) != 0) &&
                     ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar8->log_level)))) {
                    Curl_infof(data,"HTTP error before end of send, keep sending");
                  }
                  pCVar18 = Curl_creader_get_by_type(data,&cr_exp100);
                  if (pCVar18 != (Curl_creader *)0x0) {
                    http_exp100_continue(data,pCVar18);
                  }
                }
              }
            }
            _Var9 = Curl_creader_will_rewind(data);
            if ((_Var9) && (_Var9 = Curl_req_done_sending(data), !_Var9)) {
              if ((((data->set).field_0x8cd & 0x10) != 0) &&
                 ((pcVar8 = (data->state).feat, pcVar8 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar8->log_level)))) {
                Curl_infof(data,"Keep sending data to get tossed away");
              }
              piVar3 = &(data->req).keepon;
              *(byte *)piVar3 = (byte)*piVar3 | 2;
            }
          }
          uVar14 = *(uint *)&(data->req).field_0xd9;
          if ((uVar14 >> 0x11 & 1) != 0) {
            uVar14 = uVar14 | 8;
            *(uint *)&(data->req).field_0xd9 = uVar14;
          }
          if ((data->req).maxdownload == 0) {
            *(uint *)&(data->req).field_0xd9 = uVar14 | 8;
          }
          CVar10 = Curl_http_firstwrite(data);
          if (CVar10 == CURLE_OK) {
            CVar10 = Curl_http_size(data);
          }
        }
      }
    }
  }
LAB_00133ad5:
  if ((pcVar15 != (char *)0x0) &&
     (CVar11 = http_write_header(data,pcVar15,hdlen_00), CVar10 == CURLE_OK)) {
    CVar10 = CVar11;
  }
LAB_00133aed:
  Curl_dyn_free(&last_header);
  return CVar10;
}

Assistant:

static CURLcode http_rw_hd(struct Curl_easy *data,
                           const char *hd, size_t hdlen,
                           const char *buf_remain, size_t blen,
                           size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  int writetype;

  *pconsumed = 0;
  if((0x0a == *hd) || (0x0d == *hd)) {
    /* Empty header line means end of headers! */
    struct dynbuf last_header;
    size_t consumed;

    Curl_dyn_init(&last_header, hdlen + 1);
    result = Curl_dyn_addn(&last_header, hd, hdlen);
    if(result)
      return result;

    /* analyze the response to find out what to do. */
    /* Caveat: we clear anything in the header brigade, because a
     * response might switch HTTP version which may call use recursively.
     * Not nice, but that is currently the way of things. */
    Curl_dyn_reset(&data->state.headerb);
    result = http_on_response(data, Curl_dyn_ptr(&last_header),
                              Curl_dyn_len(&last_header),
                              buf_remain, blen, &consumed);
    *pconsumed += consumed;
    Curl_dyn_free(&last_header);
    return result;
  }

  /*
   * Checks for special headers coming up.
   */

  writetype = CLIENTWRITE_HEADER;
  if(!k->headerline++) {
    /* This is the first header, it MUST be the error code line
       or else we consider this to be the body right away! */
    bool fine_statusline = FALSE;

    k->httpversion = 0; /* Do not know yet */
    if(data->conn->handler->protocol & PROTO_FAMILY_HTTP) {
      /*
       * https://datatracker.ietf.org/doc/html/rfc7230#section-3.1.2
       *
       * The response code is always a three-digit number in HTTP as the spec
       * says. We allow any three-digit number here, but we cannot make
       * guarantees on future behaviors since it is not within the protocol.
       */
      const char *p = hd;

      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "HTTP/", 5)) {
        p += 5;
        switch(*p) {
        case '1':
          p++;
          if((p[0] == '.') && (p[1] == '0' || p[1] == '1')) {
            if(ISBLANK(p[2])) {
              k->httpversion = 10 + (p[1] - '0');
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p))
                  fine_statusline = TRUE;
              }
            }
          }
          if(!fine_statusline) {
            failf(data, "Unsupported HTTP/1 subversion in response");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        case '2':
        case '3':
          if(!ISBLANK(p[1]))
            break;
          k->httpversion = (*p - '0') * 10;
          p += 2;
          if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
            k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
              (p[2] - '0');
            p += 3;
            if(!ISSPACE(*p))
              break;
            fine_statusline = TRUE;
          }
          break;
        default: /* unsupported */
          failf(data, "Unsupported HTTP version in response");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }

      if(!fine_statusline) {
        /* If user has set option HTTP200ALIASES,
           compare header line against list of aliases
        */
        statusline check = checkhttpprefix(data, hd, hdlen);
        if(check == STATUS_DONE) {
          fine_statusline = TRUE;
          k->httpcode = 200;
          k->httpversion = 10;
        }
      }
    }
    else if(data->conn->handler->protocol & CURLPROTO_RTSP) {
      const char *p = hd;
      while(*p && ISBLANK(*p))
        p++;
      if(!strncmp(p, "RTSP/", 5)) {
        p += 5;
        if(ISDIGIT(*p)) {
          p++;
          if((p[0] == '.') && ISDIGIT(p[1])) {
            if(ISBLANK(p[2])) {
              p += 3;
              if(ISDIGIT(p[0]) && ISDIGIT(p[1]) && ISDIGIT(p[2])) {
                k->httpcode = (p[0] - '0') * 100 + (p[1] - '0') * 10 +
                  (p[2] - '0');
                p += 3;
                if(ISSPACE(*p)) {
                  fine_statusline = TRUE;
                  k->httpversion = 11; /* RTSP acts like HTTP 1.1 */
                }
              }
            }
          }
        }
        if(!fine_statusline)
          return CURLE_WEIRD_SERVER_REPLY;
      }
    }

    if(fine_statusline) {
      result = Curl_http_statusline(data, data->conn);
      if(result)
        return result;
      writetype |= CLIENTWRITE_STATUS;
    }
    else {
      k->header = FALSE;   /* this is not a header line */
      return CURLE_WEIRD_SERVER_REPLY;
    }
  }

  result = verify_header(data, hd, hdlen);
  if(result)
    return result;

  result = Curl_http_header(data, hd, hdlen);
  if(result)
    return result;

  /*
   * Taken in one (more) header. Write it to the client.
   */
  Curl_debug(data, CURLINFO_HEADER_IN, (char *)hd, hdlen);

  if(k->httpcode/100 == 1)
    writetype |= CLIENTWRITE_1XX;
  result = Curl_client_write(data, writetype, hd, hdlen);
  if(result)
    return result;

  result = Curl_bump_headersize(data, hdlen, FALSE);
  if(result)
    return result;

  return CURLE_OK;
}